

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.hpp
# Opt level: O2

Error * __thiscall
ot::commissioner::CommissionerImpl::PanIdQuery
          (Error *__return_storage_ptr__,CommissionerImpl *this,uint32_t param_1,uint16_t param_2,
          string *param_3)

{
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  format_args args;
  string sStack_48;
  undefined1 local_28 [24];
  
  args.field_1.args_ = in_R9.args_;
  args.desc_ = (unsigned_long_long)local_28;
  ::fmt::v10::vformat_abi_cxx11_
            (&sStack_48,(v10 *)(anon_var_dwarf_4657bc + 9),(string_view)ZEXT816(0),args);
  __return_storage_ptr__->mCode = kUnimplemented;
  std::__cxx11::string::string((string *)&__return_storage_ptr__->mMessage,(string *)&sStack_48);
  std::__cxx11::string::~string((string *)&sStack_48);
  return __return_storage_ptr__;
}

Assistant:

Error PanIdQuery(uint32_t, uint16_t, const std::string &) override { return ERROR_UNIMPLEMENTED(""); }